

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O2

bool google::protobuf::internal::ParseAnyTypeUrl(string *type_url,string *full_type_name)

{
  bool bVar1;
  long lVar2;
  string asStack_38 [32];
  
  lVar2 = std::__cxx11::string::find_last_of((char *)type_url,0x65d941);
  if ((lVar2 == -1) || (lVar2 + 1U == type_url->_M_string_length)) {
    bVar1 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)asStack_38,(ulong)type_url);
    std::__cxx11::string::operator=((string *)full_type_name,asStack_38);
    std::__cxx11::string::~string(asStack_38);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool ParseAnyTypeUrl(const string& type_url, string* full_type_name) {
  size_t pos = type_url.find_last_of("/");
  if (pos == string::npos || pos + 1 == type_url.size()) {
    return false;
  }
  *full_type_name = type_url.substr(pos + 1);
  return true;
}